

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DriverProxy.h
# Opt level: O2

int64_t __thiscall
aeron::DriverProxy::addCounter
          (DriverProxy *this,int32_t typeId,uint8_t *key,size_t keyLength,string *label)

{
  long *plVar1;
  int32_t typeId_local;
  int64_t correlationId;
  size_t keyLength_local;
  uint8_t *key_local;
  anon_class_48_6_e1d6f653 local_38;
  
  local_38.typeId = &typeId_local;
  local_38.key = &key_local;
  local_38.keyLength = &keyLength_local;
  LOCK();
  plVar1 = (long *)(this->m_toDriverCommandBuffer->m_buffer->m_buffer +
                   this->m_toDriverCommandBuffer->m_correlationIdCounterIndex);
  correlationId = *plVar1;
  *plVar1 = *plVar1 + 1;
  UNLOCK();
  local_38.correlationId = &correlationId;
  typeId_local = typeId;
  keyLength_local = keyLength;
  key_local = key;
  local_38.this = this;
  local_38.label = label;
  writeCommandToDriver<aeron::DriverProxy::addCounter(int,unsigned_char_const*,unsigned_long,std::__cxx11::string_const&)::_lambda(aeron::concurrent::AtomicBuffer&,int&)_1_>
            (this,&local_38);
  return correlationId;
}

Assistant:

std::int64_t addCounter(std::int32_t typeId, const std::uint8_t *key, std::size_t keyLength, const std::string& label)
    {
        std::int64_t correlationId = m_toDriverCommandBuffer.nextCorrelationId();

        writeCommandToDriver([&](AtomicBuffer &buffer, util::index_t &length)
        {
            CounterMessageFlyweight command(buffer, 0);

            command.clientId(m_clientId);
            command.correlationId(correlationId);
            command.typeId(typeId);
            command.keyBuffer(key, keyLength);
            command.label(label);

            length = command.length();

            return ControlProtocolEvents::ADD_COUNTER;
        });

        return correlationId;
    }